

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

int __thiscall QtMWidgets::PageView::insertWidget(PageView *this,int index,QWidget *widget)

{
  PageControl *this_00;
  QWidget *widget_00;
  int iVar1;
  int yp1;
  int iVar2;
  int iVar3;
  PageViewPrivate *pPVar4;
  Promoted<int,_long_long> PVar5;
  qsizetype qVar6;
  QRect local_50;
  QRect local_40;
  QWidget **local_30;
  qsizetype local_28;
  QWidget *local_20;
  QWidget *widget_local;
  PageView *pPStack_10;
  int index_local;
  PageView *this_local;
  
  local_20 = widget;
  widget_local._4_4_ = index;
  pPStack_10 = this;
  pPVar4 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  local_28 = QList<QWidget_*>::count(&pPVar4->pages);
  PVar5 = qMin<int,long_long>((int *)((long)&widget_local + 4),&local_28);
  widget_local._4_4_ = (int)PVar5;
  if (widget_local._4_4_ < 0) {
    pPVar4 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    qVar6 = QList<QWidget_*>::count(&pPVar4->pages);
    widget_local._4_4_ = (int)qVar6;
  }
  pPVar4 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  local_30 = (QWidget **)QList<QWidget_*>::insert(&pPVar4->pages,(long)widget_local._4_4_,local_20);
  pPVar4 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  widget_00 = local_20;
  local_50 = (QRect)QFrame::frameRect();
  iVar1 = QFrame::frameWidth();
  yp1 = QFrame::frameWidth();
  iVar2 = QFrame::frameWidth();
  iVar3 = QFrame::frameWidth();
  local_40 = QRect::adjusted(&local_50,iVar1,yp1,-iVar2,-iVar3);
  PageViewPrivate::prepareWidget(pPVar4,widget_00,&local_40);
  QWidget::hide();
  pPVar4 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  this_00 = pPVar4->control;
  pPVar4 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  qVar6 = QList<QWidget_*>::count(&pPVar4->pages);
  PageControl::setCount(this_00,(int)qVar6);
  iVar1 = currentIndex(this);
  if (iVar1 < 0) {
    setCurrentIndex(this,widget_local._4_4_);
  }
  return widget_local._4_4_;
}

Assistant:

int
PageView::insertWidget( int index, QWidget * widget )
{
	index = qMin( index, d->pages.count() );

	if( index < 0 )
		index = d->pages.count();

	d->pages.insert( index, widget );

	d->prepareWidget( widget, frameRect().adjusted( frameWidth(), frameWidth(),
		-frameWidth(), -frameWidth() ) );

	widget->hide();

	d->control->setCount( d->pages.count() );

	if ( currentIndex() < 0 )
		setCurrentIndex( index );

	return index;

}